

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
create_database(vector<const_char_*,_std::allocator<const_char_*>_> *databases)

{
  char **extra_read_only_database_paths;
  DatabaseInterface *pDVar1;
  undefined8 *in_RSI;
  
  extra_read_only_database_paths = (char **)*in_RSI;
  if (in_RSI[1] - (long)extra_read_only_database_paths == 8) {
    pDVar1 = Fossilize::create_database(*extra_read_only_database_paths,ReadOnly);
  }
  else {
    pDVar1 = Fossilize::create_concurrent_database
                       ((char *)0x0,ReadOnly,extra_read_only_database_paths,
                        in_RSI[1] - (long)extra_read_only_database_paths >> 3);
  }
  (databases->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pDVar1;
  return (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
          )(__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
            )databases;
}

Assistant:

static unique_ptr<DatabaseInterface> create_database(const vector<const char *> &databases)
{
	unique_ptr<DatabaseInterface> resolver;
	if (databases.size() == 1)
	{
		resolver.reset(create_database(databases.front(), DatabaseMode::ReadOnly));
	}
	else
	{
		resolver.reset(create_concurrent_database(nullptr, DatabaseMode::ReadOnly,
		                                          databases.data(), databases.size()));
	}
	return resolver;
}